

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox_safe.cpp
# Opt level: O0

ssize_t __thiscall
zmq::mailbox_safe_t::send(mailbox_safe_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  reference ppsVar2;
  ssize_t extraout_RAX;
  void *__buf_00;
  int __fd_00;
  undefined4 in_register_00000034;
  iterator end;
  iterator it;
  bool ok;
  ypipe_t<zmq::command_t,_16> *in_stack_ffffffffffffffc8;
  signaler_t **local_28;
  __normal_iterator<zmq::signaler_t_**,_std::vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>_>
  local_20;
  undefined1 local_11;
  undefined8 local_10;
  mailbox_safe_t *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  mutex_t::lock((mutex_t *)this);
  ypipe_t<zmq::command_t,_16>::write(&this->_cpipe,(int)local_10,(void *)0x0,__n);
  local_11 = ypipe_t<zmq::command_t,_16>::flush(in_stack_ffffffffffffffc8);
  if (!(bool)local_11) {
    condition_variable_t::broadcast((condition_variable_t *)0x2f8c92);
    local_20._M_current =
         (signaler_t **)
         std::vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>::begin
                   ((vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_> *)
                    in_stack_ffffffffffffffc8);
    local_28 = (signaler_t **)
               std::vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>::end
                         ((vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_> *)
                          in_stack_ffffffffffffffc8);
    while( true ) {
      __fd_00 = (int)&local_28;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<zmq::signaler_t_**,_std::vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>_>
                          *)this,(__normal_iterator<zmq::signaler_t_**,_std::vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>_>
                                  *)in_stack_ffffffffffffffc8);
      if (!bVar1) break;
      ppsVar2 = __gnu_cxx::
                __normal_iterator<zmq::signaler_t_**,_std::vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>_>
                ::operator*(&local_20);
      signaler_t::send(*ppsVar2,__fd_00,__buf_00,__n,__flags);
      __gnu_cxx::
      __normal_iterator<zmq::signaler_t_**,_std::vector<zmq::signaler_t_*,_std::allocator<zmq::signaler_t_*>_>_>
      ::operator++(&local_20);
    }
  }
  mutex_t::unlock((mutex_t *)this);
  return extraout_RAX;
}

Assistant:

void zmq::mailbox_safe_t::send (const command_t &cmd_)
{
    _sync->lock ();
    _cpipe.write (cmd_, false);
    const bool ok = _cpipe.flush ();

    if (!ok) {
        _cond_var.broadcast ();

        for (std::vector<signaler_t *>::iterator it = _signalers.begin (),
                                                 end = _signalers.end ();
             it != end; ++it) {
            (*it)->send ();
        }
    }

    _sync->unlock ();
}